

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nes_controller.h
# Opt level: O1

void __thiscall n_e_s::core::NesController::~NesController(NesController *this)

{
  operator_delete(this,0x10);
  return;
}

Assistant:

void set(Button button, bool state) override {
        switch (button) {
        case Button::A:
            a_ = state;
            break;
        case Button::B:
            b_ = state;
            break;
        case Button::Select:
            select_ = state;
            break;
        case Button::Start:
            start_ = state;
            break;
        case Button::Up:
            up_ = state;
            break;
        case Button::Down:
            down_ = state;
            break;
        case Button::Left:
            left_ = state;
            break;
        case Button::Right:
            right_ = state;
            break;
        }
    }